

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O0

void remove_mean_from_signal(void)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  reference pvVar3;
  size_type sVar4;
  reference pdVar5;
  undefined1 auVar6 [16];
  double *v;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  size_t i;
  double Med;
  
  i = 0;
  __range1 = (vector<double,_std::allocator<double>_> *)0x0;
  while( true ) {
    pvVar2 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size(&v_s);
    if (pvVar2 <= __range1) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&v_s,(size_type)__range1);
    i = (size_t)(*pvVar3 + (double)i);
    __range1 = (vector<double,_std::allocator<double>_> *)
               ((long)&(__range1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  sVar4 = std::vector<double,_std::allocator<double>_>::size(&v_s);
  auVar6._8_4_ = (int)(sVar4 >> 0x20);
  auVar6._0_8_ = sVar4;
  auVar6._12_4_ = 0x45300000;
  m_s = (double)i /
        ((auVar6._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  __end1 = std::vector<double,_std::allocator<double>_>::begin(&v_s);
  v = (double *)std::vector<double,_std::allocator<double>_>::end(&v_s);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                *)&v);
    if (!bVar1) break;
    pdVar5 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    *pdVar5 = *pdVar5 - m_s;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void remove_mean_from_signal() {
	double Med = 0;
	for(size_t i = 0; i < v_s.size(); i++) {
		Med += v_s[i];
	}
	m_s = Med / double(v_s.size());
	for(auto &v : v_s)v -= m_s;
}